

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pliocomp.c
# Opt level: O0

int pl_l2pi(short *ll_src,int xs,int *px_dst,int npix)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_7c;
  int local_78;
  int local_70;
  int skipwd;
  int llfirt;
  int opcode;
  int pv;
  int op;
  int np;
  int xe;
  int ip;
  int x2;
  int x1;
  int i2;
  int i1;
  int lllen;
  int i__;
  int otop;
  int sw0001;
  int data;
  int i__2;
  int i__1;
  int ret_val;
  int npix_local;
  int *px_dst_local;
  int xs_local;
  short *ll_src_local;
  
  if (ll_src[2] < 1) {
    i2 = ll_src[4] * 0x8000 + (int)ll_src[3];
    local_70 = ll_src[1] + 1;
  }
  else {
    i2 = (int)ll_src[2];
    local_70 = 4;
  }
  if ((npix < 1) || (i2 < 1)) {
    i__2 = 0;
  }
  else {
    iVar2 = xs + npix + -1;
    bVar1 = false;
    opcode = 1;
    ip = 1;
    llfirt = 1;
    for (np = local_70; np <= i2; np = np + 1) {
      if (bVar1) {
        bVar1 = false;
        goto LAB_00243a0b;
      }
      iVar3 = (int)ll_src[(long)np + -1] / 0x1000;
      uVar4 = (int)ll_src[(long)np + -1] & 0xfff;
      if (iVar3 + 1 < 1) goto switchD_002439d1_default;
      switch(iVar3) {
      case 0:
        goto LAB_00243807;
      case 1:
        llfirt = ll_src[(long)(np + 1) + -1] * 0x1000 + uVar4;
        bVar1 = true;
        break;
      case 2:
        llfirt = uVar4 + llfirt;
        break;
      case 3:
        llfirt = llfirt - uVar4;
        break;
      case 4:
        goto LAB_00243807;
      case 5:
LAB_00243807:
        iVar5 = ip + uVar4;
        iVar6 = iVar5 + -1;
        local_78 = xs;
        if (xs < ip) {
          local_78 = ip;
        }
        local_7c = iVar2;
        if (iVar6 < iVar2) {
          local_7c = iVar6;
        }
        iVar7 = (local_7c - local_78) + 1;
        ip = iVar5;
        if (0 < iVar7) {
          iVar7 = opcode + iVar7;
          iVar5 = iVar7 + -1;
          if (iVar3 == 4) {
            for (i1 = opcode; opcode = iVar7, i1 <= iVar5; i1 = i1 + 1) {
              px_dst[(long)i1 + -1] = llfirt;
            }
          }
          else {
            for (i1 = opcode; i1 <= iVar5; i1 = i1 + 1) {
              px_dst[(long)i1 + -1] = 0;
            }
            opcode = iVar7;
            if ((iVar3 == 5) && (local_7c == iVar6)) {
              px_dst[(long)iVar5 + -1] = llfirt;
            }
          }
        }
        break;
      case 6:
        goto LAB_00243964;
      case 7:
        uVar4 = -uVar4;
LAB_00243964:
        llfirt = llfirt + uVar4;
        if ((xs <= ip) && (ip <= iVar2)) {
          px_dst[(long)opcode + -1] = llfirt;
          opcode = opcode + 1;
        }
        ip = ip + 1;
      }
switchD_002439d1_default:
      if (iVar2 < ip) break;
LAB_00243a0b:
    }
    for (i1 = opcode; i__2 = npix, i1 <= npix; i1 = i1 + 1) {
      px_dst[(long)i1 + -1] = 0;
    }
  }
  return i__2;
}

Assistant:

int pl_l2pi (short *ll_src, int xs, int *px_dst, int npix)
/* short *ll_src;                   encoded line list */
/* int xs;                          starting index in ll_src */
/* int *px_dst;                    output pixel array */
/* int npix;                       number of pixels to convert */
{
    /* System generated locals */
    int ret_val, i__1, i__2;

    /* Local variables */
    int data, sw0001, otop, i__, lllen, i1, i2, x1, x2, ip, xe, np,
             op, pv, opcode, llfirt;
    int skipwd;

    /* Parameter adjustments */
    --px_dst;
    --ll_src;

    /* Function Body */
    if (! (ll_src[3] > 0)) {
        goto L110;
    }
    lllen = ll_src[3];
    llfirt = 4;
    goto L111;
L110:
    lllen = (ll_src[5] << 15) + ll_src[4];
    llfirt = ll_src[2] + 1;
L111:
    if (! (npix <= 0 || lllen <= 0)) {
        goto L120;
    }
    ret_val = 0;
    goto L100;
L120:
    xe = xs + npix - 1;
    skipwd = 0;
    op = 1;
    x1 = 1;
    pv = 1;
    i__1 = lllen;
    for (ip = llfirt; ip <= i__1; ++ip) {
        if (! skipwd) {
            goto L140;
        }
        skipwd = 0;
        goto L130;
L140:
        opcode = ll_src[ip] / 4096;
        data = ll_src[ip] & 4095;
        sw0001 = opcode;
        goto L150;
L160:
        x2 = x1 + data - 1;
        i1 = max(x1,xs);
        i2 = min(x2,xe);
        np = i2 - i1 + 1;
        if (! (np > 0)) {
            goto L170;
        }
        otop = op + np - 1;
        if (! (opcode == 4)) {
            goto L180;
        }
        i__2 = otop;
        for (i__ = op; i__ <= i__2; ++i__) {
            px_dst[i__] = pv;
/* L190: */
        }
/* L191: */
        goto L181;
L180:
        i__2 = otop;
        for (i__ = op; i__ <= i__2; ++i__) {
            px_dst[i__] = 0;
/* L200: */
        }
/* L201: */
        if (! (opcode == 5 && i2 == x2)) {
            goto L210;
        }
        px_dst[otop] = pv;
L210:
L181:
        op = otop + 1;
L170:
        x1 = x2 + 1;
        goto L151;
L220:
        pv = (ll_src[ip + 1] << 12) + data;
        skipwd = 1;
        goto L151;
L230:
        pv += data;
        goto L151;
L240:
        pv -= data;
        goto L151;
L250:
        pv += data;
        goto L91;
L260:
        pv -= data;
L91:
        if (! (x1 >= xs && x1 <= xe)) {
            goto L270;
        }
        px_dst[op] = pv;
        ++op;
L270:
        ++x1;
        goto L151;
L150:
        ++sw0001;
        if (sw0001 < 1 || sw0001 > 8) {
            goto L151;
        }
        switch ((int)sw0001) {
            case 1:  goto L160;
            case 2:  goto L220;
            case 3:  goto L230;
            case 4:  goto L240;
            case 5:  goto L160;
            case 6:  goto L160;
            case 7:  goto L250;
            case 8:  goto L260;
        }
L151:
        if (! (x1 > xe)) {
            goto L280;
        }
        goto L131;
L280:
L130:
        ;
    }
L131:
    i__1 = npix;
    for (i__ = op; i__ <= i__1; ++i__) {
        px_dst[i__] = 0;
/* L290: */
    }
/* L291: */
    ret_val = npix;
    goto L100;
L100:
    return ret_val;
}